

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

void jsondec_consumews(jsondec *d)

{
  char cVar1;
  char *pcVar2;
  
  pcVar2 = d->ptr;
  do {
    if (pcVar2 == d->end) {
      return;
    }
    cVar1 = *pcVar2;
    if (((cVar1 != '\t') && (cVar1 != ' ')) && (cVar1 != '\r')) {
      if (cVar1 != '\n') {
        return;
      }
      d->line = d->line + 1;
      d->line_begin = pcVar2;
    }
    pcVar2 = pcVar2 + 1;
    d->ptr = pcVar2;
  } while( true );
}

Assistant:

static void jsondec_consumews(jsondec* d) {
  while (d->ptr != d->end) {
    switch (*d->ptr) {
      case '\n':
        d->line++;
        d->line_begin = d->ptr;
        /* Fallthrough. */
      case '\r':
      case '\t':
      case ' ':
        d->ptr++;
        break;
      default:
        return;
    }
  }
}